

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsByteCodeGenerator.cpp
# Opt level: O1

EmitExpressionInfo __thiscall
Js::AsmJSByteCodeGenerator::EmitSwitch(AsmJSByteCodeGenerator *this,ParseNodeSwitch *pnode)

{
  AsmJsByteCodeWriter *this_00;
  ParseNode *this_01;
  AsmJsFunc *pAVar1;
  code *pcVar2;
  bool bVar3;
  RegSlot R0;
  ByteCodeLabel BVar4;
  Types type;
  undefined4 *puVar5;
  ParseNodeFloat *pPVar6;
  EmitExpressionInfo EVar7;
  ByteCodeLabel *pBVar8;
  RegisterSpace *this_02;
  AsmJsCompilationException *this_03;
  ParseNodeCase *pPVar9;
  EmitExpressionInfo local_48;
  EmitExpressionInfo local_40;
  RegSlot local_38;
  int local_34;
  
  if (pnode->pnodeVal == (ParseNodePtr)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsByteCodeGenerator.cpp"
                                ,0x92d,"(pnode->pnodeVal != __null)","pnode->pnodeVal != NULL");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  local_48 = Emit(this,pnode->pnodeVal);
  bVar3 = AsmJsType::isSigned(&local_48.type);
  if (bVar3) {
    R0 = GetAndReleaseUnaryLocations<int>(this,&local_48);
    this_00 = &this->mWriter;
    local_34 = 0;
    ByteCodeWriter::StartStatement(&this_00->super_ByteCodeWriter,(ParseNode *)pnode,0);
    local_38 = R0;
    AsmJsByteCodeWriter::AsmReg2(this_00,BeginSwitch_Int,R0,local_48.super_EmitInfoBase.location);
    ByteCodeWriter::EndStatement(&this_00->super_ByteCodeWriter,(ParseNode *)pnode);
    pPVar9 = pnode->pnodeCases;
    if (pPVar9 == (ParseNodeCase *)0x0) {
      bVar3 = true;
    }
    else {
      do {
        BVar4 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
        pPVar9->labelCase = BVar4;
        if (pPVar9 != pnode->pnodeDefault) {
          this_01 = pPVar9->pnodeExpr;
          if (this_01->nop == knopFlt) {
            pPVar6 = ParseNode::AsParseNodeFloat(this_01);
            if ((pPVar6->field_0x18 & 1) != 0) {
              pPVar6 = ParseNode::AsParseNodeFloat(this_01);
              if ((pPVar6->dbl == -2147483648.0) && (!NAN(pPVar6->dbl))) goto LAB_0094aaf3;
            }
          }
          else if (this_01->nop == knopInt) {
            ParseNode::AsParseNodeInt(this_01);
LAB_0094aaf3:
            EVar7 = Emit(this,pPVar9->pnodeExpr);
            AsmJsByteCodeWriter::AsmBrReg2
                      (this_00,Case_Int,pPVar9->labelCase,local_38,
                       EVar7.super_EmitInfoBase.location.location);
            goto LAB_0094ab18;
          }
          this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
          AsmJsCompilationException::AsmJsCompilationException
                    (this_03,L"Switch case value must be int in the range [-2^31, 2^31)");
          goto LAB_0094ac17;
        }
        local_34 = 1;
LAB_0094ab18:
        pPVar9 = pPVar9->pnodeNext;
      } while (pPVar9 != (ParseNodeCase *)0x0);
      bVar3 = local_34 == 0;
    }
    local_34 = CONCAT31(local_34._1_3_,bVar3);
    if (bVar3 == false) {
      pBVar8 = &pnode->pnodeDefault->labelCase;
    }
    else {
      if ((pnode->super_ParseNodeStmt).emitLabels == false) {
        BVar4 = ByteCodeWriter::DefineLabel(&this_00->super_ByteCodeWriter);
        (pnode->super_ParseNodeStmt).breakLabel = BVar4;
      }
      pBVar8 = &(pnode->super_ParseNodeStmt).breakLabel;
    }
    AsmJsByteCodeWriter::AsmBr(this_00,*pBVar8,EndSwitch_Int);
    pPVar9 = pnode->pnodeCases;
    if (pPVar9 != (ParseNodeCase *)0x0) {
      do {
        AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,pPVar9->labelCase);
        local_40 = Emit(this,(ParseNode *)pPVar9->pnodeBody);
        AsmJsFunc::ReleaseLocationGeneric(this->mFunction,&local_40);
        pPVar9 = pPVar9->pnodeNext;
      } while (pPVar9 != (ParseNodeCase *)0x0);
    }
    pAVar1 = this->mFunction;
    type = WAsmJs::FromPrimitiveType<int>();
    this_02 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                        (&pAVar1->mTypedRegisterAllocator,type);
    WAsmJs::RegisterSpace::ReleaseTmpRegister(this_02,local_38);
    if (((char)local_34 != '\0') || ((pnode->super_ParseNodeStmt).emitLabels == true)) {
      AsmJsByteCodeWriter::MarkAsmJsLabel(this_00,(pnode->super_ParseNodeStmt).breakLabel);
    }
    EVar7.super_EmitInfoBase.location = 0xffffffff;
    EVar7.type.which_ = Void;
    return EVar7;
  }
  this_03 = (AsmJsCompilationException *)__cxa_allocate_exception(0x200);
  AsmJsCompilationException::AsmJsCompilationException
            (this_03,L"Switch value must be type Signed, FixNum");
LAB_0094ac17:
  __cxa_throw(this_03,&AsmJsCompilationException::typeinfo,0);
}

Assistant:

EmitExpressionInfo AsmJSByteCodeGenerator::EmitSwitch( ParseNodeSwitch * pnode )
    {
        BOOL fHasDefault = false;
        Assert( pnode->pnodeVal != NULL );
        const EmitExpressionInfo& valInfo = Emit( pnode->pnodeVal );

        if( !valInfo.type.isSigned() )
        {
            throw AsmJsCompilationException( _u("Switch value must be type Signed, FixNum") );
        }

        RegSlot regVal = GetAndReleaseUnaryLocations<int>( &valInfo );
        StartStatement(pnode);
        mWriter.AsmReg2(OpCodeAsmJs::BeginSwitch_Int, regVal, valInfo.location);
        EndStatement(pnode);

        // TODO: if all cases are compile-time constants, emit a switch statement in the byte
        // code so the BE can optimize it.

        ParseNodeCase *pnodeCase;
        for( pnodeCase = pnode->pnodeCases; pnodeCase; pnodeCase = pnodeCase->pnodeNext )
        {
            // Jump to the first case body if this one doesn't match. Make sure any side-effects of the case
            // expression take place regardless.
            pnodeCase->labelCase = mWriter.DefineLabel();
            if( pnodeCase == pnode->pnodeDefault )
            {
                fHasDefault = true;
                continue;
            }
            ParseNode* caseExpr = pnodeCase->pnodeExpr;
            if ((caseExpr->nop != knopInt || (caseExpr->AsParseNodeInt()->lw >> 31) > 1) && !ParserWrapper::IsMinInt(caseExpr))
            {
                throw AsmJsCompilationException( _u("Switch case value must be int in the range [-2^31, 2^31)") );
            }

            const EmitExpressionInfo& caseExprInfo = Emit( pnodeCase->pnodeExpr );
            mWriter.AsmBrReg2( OpCodeAsmJs::Case_Int, pnodeCase->labelCase, regVal, caseExprInfo.location );
            // do not need to release location because int constants cannot be released
        }

        // No explicit case value matches. Jump to the default arm (if any) or break out altogether.
        if( fHasDefault )
        {
            mWriter.AsmBr( pnode->pnodeDefault->labelCase, OpCodeAsmJs::EndSwitch_Int );
        }
        else
        {
            if( !pnode->emitLabels )
            {
                pnode->breakLabel = mWriter.DefineLabel();
            }
            mWriter.AsmBr( pnode->breakLabel, OpCodeAsmJs::EndSwitch_Int );
        }
        // Now emit the case arms to which we jump on matching a case value.
        for( pnodeCase = pnode->pnodeCases; pnodeCase; pnodeCase = pnodeCase->pnodeNext )
        {
            mWriter.MarkAsmJsLabel( pnodeCase->labelCase );
            const EmitExpressionInfo& caseBodyInfo = Emit( pnodeCase->pnodeBody );
            mFunction->ReleaseLocationGeneric( &caseBodyInfo );
        }

        mFunction->ReleaseTmpRegister<int>( regVal );

        if( !fHasDefault || pnode->emitLabels )
        {
            mWriter.MarkAsmJsLabel( pnode->breakLabel );
        }

        return EmitExpressionInfo( AsmJsType::Void );
    }